

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkBeamIGAslider.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLinkBeamIGAslider::IntToDescriptor
          (ChLinkBeamIGAslider *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  ulong uVar1;
  double *pdVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  
  iVar3 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])
                    (this,CONCAT44(in_register_00000034,off_v));
  if ((char)iVar3 == '\0') {
    return;
  }
  uVar1 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  uVar4 = (ulong)off_L;
  if ((long)uVar4 < (long)uVar1) {
    pdVar2 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar5 = (ulong)(off_L + 1);
    (this->constraint2).super_ChConstraint.l_i = pdVar2[uVar4];
    if (uVar5 < uVar1) {
      (this->constraint3).super_ChConstraint.l_i = pdVar2[uVar5];
      uVar1 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      if ((long)uVar4 < (long)uVar1) {
        pdVar2 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        (this->constraint2).super_ChConstraint.b_i = pdVar2[uVar4];
        if (uVar5 < uVar1) {
          (this->constraint3).super_ChConstraint.b_i = pdVar2[uVar5];
          return;
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChLinkBeamIGAslider::IntToDescriptor(const unsigned int off_v,
                                          const ChStateDelta& v,
                                          const ChVectorDynamic<>& R,
                                          const unsigned int off_L,
                                          const ChVectorDynamic<>& L,
                                          const ChVectorDynamic<>& Qc) {
    if (!IsActive())
        return;

    // constraint1.Set_l_i(L(off_L + 0));
    constraint2.Set_l_i(L(off_L + 0));
    constraint3.Set_l_i(L(off_L + 1));

    // constraint1.Set_b_i(Qc(off_L + 0));
    constraint2.Set_b_i(Qc(off_L + 0));
    constraint3.Set_b_i(Qc(off_L + 1));
}